

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

RIP * __thiscall ASDCP::MXF::RIP::InitFromFile(RIP *this,IFileReader *Reader)

{
  bool bVar1;
  MDDEntry *pMVar2;
  ILogSink *pIVar3;
  UL *in_RDX;
  undefined **local_100;
  undefined1 local_f8;
  undefined8 local_f7;
  undefined8 uStack_ef;
  MemIOReader MemRDR;
  Result_t result;
  
  if (*(Dictionary **)(Reader + 0x70) == (Dictionary *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x7b,
                  "virtual ASDCP::Result_t ASDCP::MXF::RIP::InitFromFile(const Kumu::IFileReader &)"
                 );
  }
  pMVar2 = Dictionary::Type(*(Dictionary **)(Reader + 0x70),MDD_RandomIndexMetadata);
  local_f8 = 1;
  local_f7 = *(undefined8 *)pMVar2->ul;
  uStack_ef = *(undefined8 *)(pMVar2->ul + 8);
  local_100 = &PTR__IArchive_002112c8;
  KLVFilePacket::InitFromFile((KLVFilePacket *)&result,Reader,in_RDX);
  if (_result < 0) {
LAB_001959ea:
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar3,"Failed to initialize RIP.\n");
  }
  else {
    if (*(ulong *)(Reader + 0x20) < 4) {
      pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar3,"RIP is too short.\n");
      local_100 = (undefined **)CONCAT44(local_100._4_4_,0x83);
      Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
      goto LAB_00195a10;
    }
    Kumu::MemIOReader::MemIOReader
              (&MemRDR,*(byte_t **)(Reader + 0x18),(int)*(ulong *)(Reader + 0x20) - 4);
    bVar1 = SimpleArray<ASDCP::MXF::RIP::PartitionPair>::Unarchive
                      ((SimpleArray<ASDCP::MXF::RIP::PartitionPair> *)(Reader + 0x78),&MemRDR);
    if (bVar1) {
      Kumu::Result_t::Result_t((Result_t *)&local_100,(Result_t *)&Kumu::RESULT_OK);
    }
    else {
      Kumu::Result_t::operator()((int *)&local_100,ASDCP::RESULT_KLV_CODING);
    }
    Kumu::Result_t::operator=(&result,(Result_t *)&local_100);
    Kumu::Result_t::~Result_t((Result_t *)&local_100);
    if (_result < 0) goto LAB_001959ea;
  }
  Kumu::Result_t::Result_t((Result_t *)this,&result);
LAB_00195a10:
  Kumu::Result_t::~Result_t(&result);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::RIP::InitFromFile(const Kumu::IFileReader& Reader)
{
  assert(m_Dict);
  Result_t result = KLVFilePacket::InitFromFile(Reader, m_Dict->ul(MDD_RandomIndexMetadata));

  if ( ASDCP_SUCCESS(result) )
    {
      if (m_ValueLength < 4)
      {
        DefaultLogSink().Error("RIP is too short.\n");
        return RESULT_KLV_CODING(__LINE__, __FILE__);
      }
      Kumu::MemIOReader MemRDR(m_ValueStart, m_ValueLength - 4);
      result = PairArray.Unarchive(&MemRDR) ? RESULT_OK : RESULT_KLV_CODING(__LINE__, __FILE__);
    }

  if ( ASDCP_FAILURE(result) )
    DefaultLogSink().Error("Failed to initialize RIP.\n");

  return result;
}